

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O1

void resolve_path(char *buf,size_t buflen,char *path)

{
  ulong __n;
  bool bVar1;
  size_t sVar2;
  char *__name;
  char *__s;
  char cVar3;
  char *pcVar4;
  char *filename;
  char *pcVar5;
  
  sVar2 = strlen((char *)buflen);
  __n = sVar2 + 1;
  __name = (char *)operator_new__(__n);
  cVar3 = '\0';
  memset(__name,0,__n);
  memcpy(__name,(void *)buflen,__n);
  filename = __name + sVar2;
  do {
    __s = realpath(__name,(char *)0x0);
    *filename = cVar3;
    if (__s == (char *)0x0) {
      do {
        pcVar5 = filename;
        if (filename <= __name) break;
        pcVar4 = filename + -1;
        filename = filename + -1;
      } while (*pcVar4 != '/');
      do {
        filename = pcVar5;
        if (filename <= __name) break;
        pcVar5 = filename + -1;
      } while (filename[-1] == '/');
      pcVar5 = filename;
      if (filename == __name) {
        if (__name != buf && buf != (char *)0x0) {
          sVar2 = strlen(__name);
          pcVar4 = __name;
          if (0xffe < sVar2) {
            sVar2 = 0xfff;
          }
          goto LAB_001042ea;
        }
        goto LAB_001042c6;
      }
      cVar3 = *filename;
      bVar1 = true;
LAB_001042f7:
      *filename = '\0';
    }
    else {
      if (cVar3 == '\0') {
        if (__s != buf && buf != (char *)0x0) {
          sVar2 = strlen(__s);
          pcVar4 = __s;
          pcVar5 = filename;
          if (0xffe < sVar2) {
            sVar2 = 0xfff;
          }
LAB_001042ea:
          memcpy(buf,pcVar4,sVar2);
          filename = buf + sVar2;
          bVar1 = false;
          goto LAB_001042f7;
        }
      }
      else {
        filename = filename + -1;
        do {
          pcVar5 = filename + 1;
          filename = filename + 1;
        } while (*pcVar5 == '/');
        os_build_full_path(buf,0x1000,__s,filename);
      }
LAB_001042c6:
      bVar1 = false;
      pcVar5 = filename;
    }
    if (__s != (char *)0x0) {
      free(__s);
    }
    filename = pcVar5;
    if (!bVar1) {
      operator_delete__(__name);
      return;
    }
  } while( true );
}

Assistant:

static void
resolve_path( char *buf, size_t buflen, const char *path )
{
    // Starting with the full path string, try resolving the path with
    // realpath().  The tricky bit is that realpath() will fail if any
    // component of the path doesn't exist, but we need to resolve paths
    // for prospective filenames, such as files or directories we're
    // about to create.  So if realpath() fails, remove the last path
    // component and try again with the remainder.  Repeat until we
    // can resolve a real path, or run out of components to remove.
    // The point of this algorithm is that it will resolve as much of
    // the path as actually exists in the file system, ensuring that
    // we resolve any links that affect the path.  Any portion of the
    // path that doesn't exist obviously can't refer to a link, so it
    // will be taken literally.  Once we've resolved the longest prefix,
    // tack the stripped portion back on to form the fully resolved
    // path.

    // make a writable copy of the path to work with
    size_t pathl = strlen(path);
    const auto mypath = std::make_unique<char[]>(pathl + 1);
    memcpy(mypath.get(), path, pathl + 1);

    // start at the very end of the path, with no stripped suffix yet
    char *suffix = mypath.get() + pathl;
    char sl = '\0';

    // keep going until we resolve something or run out of path
    for (;;)
    {
        // resolve the current prefix, allocating the result
        const std::unique_ptr<char, decltype(&free)>
                rpath(realpath(mypath.get(), 0), &free);

        // un-split the path
        *suffix = sl;

        // if we resolved the prefix, return the result
        if (rpath)
        {
            // success - if we separated a suffix, reattach it
            if (*suffix != '\0')
            {
                // reattach the suffix (the part after the '/')
                for ( ; *suffix == '/' ; ++suffix) ;
                os_build_full_path(buf, buflen, rpath.get(), suffix);
            }
            else
            {
                // no suffix, so we resolved the entire path
                safe_strcpy(buf, buflen, rpath.get());
            }

            // done searching
            break;
        }

        // no luck with realpath(); search for the '/' at the end of the
        // previous component in the path 
        for ( ; suffix > mypath.get() && *(suffix-1) != '/' ; --suffix) ;

        // skip any redundant slashes
        for ( ; suffix > mypath.get() && *(suffix-1) == '/' ; --suffix) ;

        // if we're at the root element, we're out of path elements
        if (suffix == mypath.get())
        {
            // we can't resolve any part of the path, so just return the
            // original path unchanged
            safe_strcpy(buf, buflen, mypath.get());
            break;
        }

        // split the path here into prefix and suffix, and try again
        sl = *suffix;
        *suffix = '\0';
    }
}